

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3MatchSpanName(char *zSpan,char *zCol,char *zTab,char *zDb)

{
  byte bVar1;
  int iVar2;
  uchar *b;
  long lVar3;
  byte *pbVar4;
  char *zLeft;
  
  lVar3 = 0;
  for (zLeft = zSpan + 1; (zLeft[-1] != '\0' && (zLeft[-1] != '.')); zLeft = zLeft + 1) {
    lVar3 = lVar3 + 1;
  }
  if (zDb != (char *)0x0) {
    iVar2 = sqlite3_strnicmp(zSpan,zDb,(int)lVar3);
    if (iVar2 != 0) {
      return 0;
    }
    if (zDb[lVar3] != '\0') {
      return 0;
    }
  }
  lVar3 = 0;
  for (pbVar4 = (byte *)(zLeft + 2); (pbVar4[-2] != 0 && (pbVar4[-2] != 0x2e)); pbVar4 = pbVar4 + 1)
  {
    lVar3 = lVar3 + 1;
  }
  if (zTab != (char *)0x0) {
    iVar2 = sqlite3_strnicmp(zLeft,zTab,(int)lVar3);
    if (iVar2 != 0) {
      return 0;
    }
    if (zTab[lVar3] != '\0') {
      return 0;
    }
  }
  if (zCol != (char *)0x0) {
    bVar1 = pbVar4[-1];
    while ((bVar1 != 0 && (""[bVar1] == ""[(byte)*zCol]))) {
      zCol = (char *)((byte *)zCol + 1);
      bVar1 = *pbVar4;
      pbVar4 = pbVar4 + 1;
    }
    if (""[bVar1] != ""[(byte)*zCol]) {
      return 0;
    }
  }
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3MatchSpanName(
  const char *zSpan,
  const char *zCol,
  const char *zTab,
  const char *zDb
){
  int n;
  for(n=0; ALWAYS(zSpan[n]) && zSpan[n]!='.'; n++){}
  if( zDb && (sqlite3StrNICmp(zSpan, zDb, n)!=0 || zDb[n]!=0) ){
    return 0;
  }
  zSpan += n+1;
  for(n=0; ALWAYS(zSpan[n]) && zSpan[n]!='.'; n++){}
  if( zTab && (sqlite3StrNICmp(zSpan, zTab, n)!=0 || zTab[n]!=0) ){
    return 0;
  }
  zSpan += n+1;
  if( zCol && sqlite3StrICmp(zSpan, zCol)!=0 ){
    return 0;
  }
  return 1;
}